

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kyber.cc
# Opt level: O0

int kyber_marshal_public_key(CBB *out,public_key *pub)

{
  int iVar1;
  uint8_t *local_28;
  uint8_t *vector_output;
  public_key *pub_local;
  CBB *out_local;
  
  vector_output = (uint8_t *)pub;
  pub_local = (public_key *)out;
  iVar1 = CBB_add_space(out,&local_28,0x480);
  if (iVar1 == 0) {
    out_local._4_4_ = 0;
  }
  else {
    vector_encode(local_28,(vector *)vector_output,0xc);
    iVar1 = CBB_add_bytes((CBB *)pub_local,vector_output + 0x600,0x20);
    if (iVar1 == 0) {
      out_local._4_4_ = 0;
    }
    else {
      out_local._4_4_ = 1;
    }
  }
  return out_local._4_4_;
}

Assistant:

static int kyber_marshal_public_key(CBB *out, const struct public_key *pub) {
  uint8_t *vector_output;
  if (!CBB_add_space(out, &vector_output, kEncodedVectorSize)) {
    return 0;
  }
  vector_encode(vector_output, &pub->t, kLog2Prime);
  if (!CBB_add_bytes(out, pub->rho, sizeof(pub->rho))) {
    return 0;
  }
  return 1;
}